

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall
icu_63::double_conversion::Bignum::AssignHexString(Bignum *this,Vector<const_char> value)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  Chunk current_bigit;
  uint uVar8;
  int j;
  int iVar9;
  long lVar10;
  
  iVar9 = value.length_;
  Zero(this);
  uVar2 = iVar9 / 7;
  if (0x37f < iVar9) {
    abort();
  }
  iVar9 = iVar9 + -1;
  puVar1 = (this->bigits_).start_;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    pcVar6 = value.start_ + iVar9;
    uVar8 = 0;
    for (iVar7 = 0; iVar7 != 0x1c; iVar7 = iVar7 + 4) {
      iVar3 = HexCharValue(*pcVar6);
      uVar8 = uVar8 + (iVar3 << ((byte)iVar7 & 0x1f));
      pcVar6 = pcVar6 + -1;
    }
    iVar9 = iVar9 + -7;
    puVar1[uVar5] = uVar8;
  }
  this->used_digits_ = uVar2;
  uVar8 = 0;
  for (lVar10 = 0; lVar10 <= iVar9; lVar10 = lVar10 + 1) {
    iVar7 = HexCharValue(value.start_[lVar10]);
    uVar8 = uVar8 * 0x10 + iVar7;
  }
  if (uVar8 != 0) {
    puVar1[(int)uVar2] = uVar8;
    this->used_digits_ = this->used_digits_ + 1;
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  int length = value.length();

  int needed_bigits = length * 4 / kBigitSize + 1;
  EnsureCapacity(needed_bigits);
  int string_index = length - 1;
  for (int i = 0; i < needed_bigits - 1; ++i) {
    // These bigits are guaranteed to be "full".
    Chunk current_bigit = 0;
    for (int j = 0; j < kBigitSize / 4; j++) {
      current_bigit += HexCharValue(value[string_index--]) << (j * 4);
    }
    bigits_[i] = current_bigit;
  }
  used_digits_ = needed_bigits - 1;

  Chunk most_significant_bigit = 0;  // Could be = 0;
  for (int j = 0; j <= string_index; ++j) {
    most_significant_bigit <<= 4;
    most_significant_bigit += HexCharValue(value[j]);
  }
  if (most_significant_bigit != 0) {
    bigits_[used_digits_] = most_significant_bigit;
    used_digits_++;
  }
  Clamp();
}